

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Gia_Man_t * Gia_ManDupConeSupp(Gia_Man_t *p,int iLit,Vec_Int_t *vCiIds)

{
  Gia_Obj_t *pGVar1;
  char *pcVar2;
  ulong uVar3;
  Gia_Obj_t *pGVar4;
  Vec_Int_t *pVVar5;
  uint uVar6;
  Vec_Int_t *vObjs;
  int *piVar7;
  Gia_Man_t *p_00;
  size_t sVar8;
  char *pcVar9;
  Gia_Obj_t *pGVar10;
  int iVar11;
  long lVar12;
  
  if (iLit < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                  ,0x12f,"int Abc_Lit2Var(int)");
  }
  uVar6 = (uint)iLit >> 1;
  iVar11 = p->nObjs;
  if (iVar11 <= (int)uVar6) {
LAB_001e4d5c:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  pGVar1 = p->pObjs;
  vObjs = (Vec_Int_t *)malloc(0x10);
  vObjs->nCap = 1000;
  vObjs->nSize = 0;
  piVar7 = (int *)malloc(4000);
  vObjs->pArray = piVar7;
  if ((p->vCopies).nSize < iVar11) {
    Vec_IntFillExtra(&p->vCopies,iVar11,-1);
    iVar11 = p->nObjs;
  }
  p_00 = Gia_ManStart(iVar11);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar2);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar2);
  }
  p_00->pName = pcVar9;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar2);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar2);
  }
  p_00->pSpec = pcVar9;
  if (0 < vCiIds->nSize) {
    lVar12 = 0;
    do {
      iVar11 = vCiIds->pArray[lVar12];
      if (((long)iVar11 < 0) || (p->vCis->nSize <= iVar11)) goto LAB_001e4d7b;
      iVar11 = p->vCis->pArray[iVar11];
      if (((long)iVar11 < 0) || (p->nObjs <= iVar11)) goto LAB_001e4d5c;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar10 = Gia_ManAppendObj(p_00);
      uVar3 = *(ulong *)pGVar10;
      *(ulong *)pGVar10 = uVar3 | 0x9fffffff;
      *(ulong *)pGVar10 =
           uVar3 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar4 = p_00->pObjs;
      if ((pGVar10 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar10)) {
LAB_001e4d9a:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar4) >> 2) * -0x55555555);
      pGVar4 = p_00->pObjs;
      if ((pGVar10 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar10)) goto LAB_001e4d9a;
      if ((p->vCopies).nSize <= iVar11) goto LAB_001e4db9;
      (p->vCopies).pArray[iVar11] = (int)((ulong)((long)pGVar10 - (long)pGVar4) >> 2) * 0x55555556;
      lVar12 = lVar12 + 1;
    } while (lVar12 < vCiIds->nSize);
  }
  Gia_ManDupConeSupp_rec(p_00,p,pGVar1 + uVar6,vObjs);
  if ((p->vCopies).nSize <= (int)uVar6) {
LAB_001e4d7b:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  uVar6 = (p->vCopies).pArray[uVar6];
  if ((int)uVar6 < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                  ,0x132,"int Abc_LitNotCond(int, int)");
  }
  Gia_ManAppendCo(p_00,uVar6 ^ iLit & 1U);
  if (0 < vCiIds->nSize) {
    piVar7 = vCiIds->pArray;
    pVVar5 = p->vCis;
    lVar12 = 0;
    do {
      iVar11 = piVar7[lVar12];
      if (((long)iVar11 < 0) || (pVVar5->nSize <= iVar11)) goto LAB_001e4d7b;
      iVar11 = pVVar5->pArray[iVar11];
      if (((long)iVar11 < 0) || (p->nObjs <= iVar11)) goto LAB_001e4d5c;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if ((p->vCopies).nSize <= iVar11) goto LAB_001e4db9;
      (p->vCopies).pArray[iVar11] = -1;
      lVar12 = lVar12 + 1;
    } while (lVar12 < vCiIds->nSize);
  }
  piVar7 = vObjs->pArray;
  if (vObjs->nSize < 1) {
    if (piVar7 == (int *)0x0) goto LAB_001e4d42;
  }
  else {
    lVar12 = 0;
    do {
      iVar11 = piVar7[lVar12];
      if (((long)iVar11 < 0) || (p->nObjs <= iVar11)) goto LAB_001e4d5c;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if ((p->vCopies).nSize <= iVar11) {
LAB_001e4db9:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (p->vCopies).pArray[iVar11] = -1;
      lVar12 = lVar12 + 1;
    } while (lVar12 < vObjs->nSize);
  }
  free(piVar7);
LAB_001e4d42:
  free(vObjs);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupConeSupp( Gia_Man_t * p, int iLit, Vec_Int_t * vCiIds )
{
    Gia_Man_t * pNew; int i, iLit0;
    Gia_Obj_t * pObj, * pRoot = Gia_ManObj( p, Abc_Lit2Var(iLit) );
    Vec_Int_t * vObjs = Vec_IntAlloc( 1000 );
    //assert( Gia_ObjIsAnd(pRoot) );
    if ( Vec_IntSize(&p->vCopies) < Gia_ManObjNum(p) )
        Vec_IntFillExtra( &p->vCopies, Gia_ManObjNum(p), -1 );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManForEachCiVec( vCiIds, p, pObj, i )
        Gia_ObjSetCopyArray( p, Gia_ObjId(p, pObj), Gia_ManAppendCi(pNew) );
    Gia_ManDupConeSupp_rec( pNew, p, pRoot, vObjs );
    iLit0 = Gia_ObjCopyArray( p, Abc_Lit2Var(iLit) );
    iLit0 = Abc_LitNotCond( iLit0, Abc_LitIsCompl(iLit) );
    Gia_ManAppendCo( pNew, iLit0 );
    Gia_ManForEachCiVec( vCiIds, p, pObj, i )
        Gia_ObjSetCopyArray( p, Gia_ObjId(p, pObj), -1 );
    Gia_ManForEachObjVec( vObjs, p, pObj, i )
        Gia_ObjSetCopyArray( p, Gia_ObjId(p, pObj), -1 );
    Vec_IntFree( vObjs );
    //assert( Vec_IntCountLarger(&p->vCopies, -1) == 0 );
    return pNew;
}